

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataconvertergenerator.cpp
# Opt level: O2

string * __thiscall
DataConverterGenerator::generateCode_abi_cxx11_
          (string *__return_storage_ptr__,DataConverterGenerator *this)

{
  int *in_RDX;
  int *extraout_RDX;
  ulong uVar1;
  string indexString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = 0;
  while (uVar1 < (ulong)((long)(this->function_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->function_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    local_90._M_dataplus._M_p._0_4_ = (undefined4)(uVar1 + 1);
    boost::lexical_cast<std::__cxx11::string,int>(&local_50,(boost *)&local_90,in_RDX);
    std::operator+(&local_70,"    for(int i = 0; i < mux",&local_50);
    std::operator+(&local_90,&local_70,".size(); i++) {\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    functionToString_abi_cxx11_(&local_90,this,(int)uVar1);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    in_RDX = extraout_RDX;
    uVar1 = uVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DataConverterGenerator::generateCode() {
  std::string code;

  for(int i = 0; i < function_.size(); i++) {
    std::string indexString = boost::lexical_cast<std::string>(i + 1);
    code += "    for(int i = 0; i < mux" + indexString + ".size(); i++) {\n";
    code += functionToString(i);
    code += "    }\n\n";
  }

  return code;
}